

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::TestCallback::toAdmin(TestCallback *this,Message *message,SessionID *param_2)

{
  FieldMap *this_00;
  MsgType msgType;
  FieldBase local_80;
  
  FIX::StringField::StringField((StringField *)&local_80,0x23);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00324788;
  this_00 = (FieldMap *)(message + 0x70);
  FIX::FieldMap::getField(this_00,&local_80);
  switch(*local_80.m_string._M_dataplus._M_p) {
  case '0':
    this->toHeartbeat = this->toHeartbeat + 1;
    FIX::FieldMap::operator=((FieldMap *)&this->sentHeartbeat,(FieldMap *)message);
    FIX::FieldMap::operator=((FieldMap *)&this->field_0x4e8,this_00);
    FIX::FieldMap::operator=((FieldMap *)&this->field_0x558,(FieldMap *)(message + 0xe0));
    *(undefined8 *)&this->field_0x5c8 = *(undefined8 *)(message + 0x150);
    break;
  case '1':
    break;
  case '2':
    this->toResendRequest = this->toResendRequest + 1;
    FIX::FieldMap::operator=((FieldMap *)&this->sentResendRequest,(FieldMap *)message);
    FIX::FieldMap::operator=((FieldMap *)&this->field_0x390,this_00);
    FIX::FieldMap::operator=((FieldMap *)&this->field_0x400,(FieldMap *)(message + 0xe0));
    *(undefined8 *)&this->field_0x470 = *(undefined8 *)(message + 0x150);
    break;
  case '3':
    this->toReject = this->toReject + 1;
    break;
  case '4':
    this->toSequenceReset = this->toSequenceReset + 1;
    break;
  case '5':
    this->toLogout = this->toLogout + 1;
    break;
  default:
    if (*local_80.m_string._M_dataplus._M_p == 'A') {
      this->toLogon = this->toLogon + 1;
      FIX::FieldMap::operator=((FieldMap *)&this->sentLogon,(FieldMap *)message);
      FIX::FieldMap::operator=((FieldMap *)&this->field_0x238,this_00);
      FIX::FieldMap::operator=((FieldMap *)&this->field_0x2a8,(FieldMap *)(message + 0xe0));
      *(undefined8 *)&this->field_0x318 = *(undefined8 *)(message + 0x150);
    }
  }
  FIX::FieldBase::~FieldBase(&local_80);
  return;
}

Assistant:

virtual void toAdmin( FIX::Message& message, const SessionID& )
  {
    MsgType msgType;
    message.getHeader().getField( msgType );
    switch ( msgType.getValue() [ 0 ] )
    {
      case 'A':
      toLogon++; sentLogon = message; break;
      case '2':
      toResendRequest++;
      sentResendRequest = message; break;
      case '0':
      toHeartbeat++; sentHeartbeat = message; break;
      case '5':
      toLogout++; break;
      case '3':
      toReject++; break;
      case '4':
      toSequenceReset++; break;
    }
  }